

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O0

void __thiscall Memory::ReferencedArenaAdapter::ReleaseStrongReference(ReferencedArenaAdapter *this)

{
  ReferencedArenaAdapter *this_local;
  
  CCLock::Enter(&(this->adapterLock).super_CCLock);
  this->strongRefCount = this->strongRefCount - 1;
  if ((((this->deleteFlag & 1U) != 0) && (this->arena != (ArenaAllocator *)0x0)) &&
     (this->strongRefCount == 0)) {
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&HeapAllocator::Instance,this->arena);
    this->arena = (ArenaAllocator *)0x0;
  }
  CCLock::Leave(&(this->adapterLock).super_CCLock);
  return;
}

Assistant:

void ReleaseStrongReference()
    {
        adapterLock.Enter();
        strongRefCount--;

        if (deleteFlag && this->arena && 0 == strongRefCount)
        {
            // All strong references are gone, delete the arena
            HeapDelete(this->arena);
            this->arena = NULL;
        }

        adapterLock.Leave();
    }